

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

vm_obj_id_t __thiscall CVmObjVector::create_copy(CVmObjVector *this,vm_val_t *self_val)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t obj_id;
  CVmObjVector *this_00;
  
  pvVar4 = sp_;
  uVar3 = *(undefined4 *)&self_val->field_0x4;
  aVar2 = self_val->val;
  sp_ = sp_ + 1;
  pvVar4->typ = self_val->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar2;
  obj_id = vm_new_id(0,1,0);
  this_00 = (CVmObjVector *)CVmObject::operator_new(0x10,obj_id);
  CVmObjVector(this_00,(ulong)*(ushort *)(this->super_CVmObjCollection).super_CVmObject.ext_);
  *(undefined2 *)((this_00->super_CVmObjCollection).super_CVmObject.ext_ + 2) =
       *(undefined2 *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
  memcpy((this_00->super_CVmObjCollection).super_CVmObject.ext_ + 4,pcVar1 + 4,
         (ulong)*(ushort *)(pcVar1 + 2) * 5);
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjVector::create_copy(VMG_ const vm_val_t *self_val)
{
    vm_obj_id_t new_id;
    CVmObjVector *new_vec;
    
    /* save the original object on the stack for gc protection */
    G_stk->push(self_val);

    /* create a new vector with the same parameters as this one */
    new_id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    new_vec = new (vmg_ new_id) CVmObjVector(vmg_ get_allocated_count());
    new_vec->set_element_count(get_element_count());

    /* copy the elements from the old vector to the new vector */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(get_element_count()));

    /* done with the gc protection - discard it */
    G_stk->discard(1);

    /* return the new vector's object ID */
    return new_id;
}